

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_no_geom_tri_improve(REF_GRID ref_grid,REF_INT node)

{
  REF_DBL *pRVar1;
  REF_NODE pRVar2;
  REF_INTERP pRVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  int local_124;
  bool local_11e;
  bool local_11d;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs;
  REF_BOOL pliant_smoothing;
  REF_INTERP ref_interp;
  REF_INT interp_guess;
  REF_STATUS interp_status;
  REF_BOOL geom_face;
  REF_BOOL accept;
  REF_BOOL allowed;
  REF_INT ids [2];
  REF_INT n_ids;
  REF_INT ixyz;
  REF_DBL max_ratio;
  REF_DBL min_ratio;
  REF_DBL tet_quality;
  REF_DBL tri_quality;
  REF_DBL tri_quality0;
  REF_DBL backoff;
  REF_DBL original [3];
  REF_DBL local_48;
  REF_DBL ideal [3];
  REF_INT tries;
  REF_NODE ref_node;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  pRVar2 = ref_grid->node;
  pRVar3 = ref_grid->interp;
  if ((node < 0) || (ref_grid->cell[6]->ref_adj->nnode <= node)) {
    local_108 = -1;
  }
  else {
    local_108 = ref_grid->cell[6]->ref_adj->first[node];
  }
  if (local_108 != -1) {
    return 0;
  }
  if ((node < 0) || (ref_grid->cell[9]->ref_adj->nnode <= node)) {
    local_10c = -1;
  }
  else {
    local_10c = ref_grid->cell[9]->ref_adj->first[node];
  }
  if (local_10c == -1) {
    if ((node < 0) || (ref_grid->cell[10]->ref_adj->nnode <= node)) {
      local_110 = -1;
    }
    else {
      local_110 = ref_grid->cell[10]->ref_adj->first[node];
    }
    if (local_110 == -1) {
      if ((node < 0) || (ref_grid->cell[0xb]->ref_adj->nnode <= node)) {
        local_114 = -1;
      }
      else {
        local_114 = ref_grid->cell[0xb]->ref_adj->first[node];
      }
      if (local_114 == -1) {
        if ((node < 0) || (ref_grid->cell[0]->ref_adj->nnode <= node)) {
          local_118 = -1;
        }
        else {
          local_118 = ref_grid->cell[0]->ref_adj->first[node];
        }
        if (local_118 != -1) {
          return 0;
        }
        uVar6 = ref_cell_id_list_around(ref_grid->cell[3],node,2,ids,&accept);
        if ((uVar6 != 0) && (uVar6 != 7)) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x415,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"count faceids");
          return uVar6;
        }
        if (1 < ids[0]) {
          return 0;
        }
        uVar6 = ref_geom_is_a(ref_grid->geom,node,2,&interp_guess);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x41a,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"face check");
          return uVar6;
        }
        if (interp_guess != 0) {
          return 0;
        }
        uVar6 = ref_smooth_node_same_normal(ref_grid,node,&geom_face);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x41d,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"normal dev");
          return uVar6;
        }
        if (geom_face == 0) {
          return 0;
        }
        for (ids[1] = 0; ids[1] < 3; ids[1] = ids[1] + 1) {
          original[(long)ids[1] + -1] = pRVar2->real[ids[1] + node * 0xf];
        }
        ref_interp._4_4_ = -1;
        if ((pRVar3 != (REF_INTERP)0x0) && (pRVar3->continuously != 0)) {
          ref_interp._4_4_ = pRVar3->cell[node];
        }
        uVar6 = ref_smooth_tri_quality_around(ref_grid,node,&tri_quality);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x429,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"q");
          return uVar6;
        }
        uVar6 = ref_smooth_tri_ratio_around(ref_grid,node,&max_ratio,(REF_DBL *)&n_ids);
        if (uVar6 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x42b,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"ratio");
          return uVar6;
        }
        bVar5 = false;
        if ((0.5 < tri_quality) && (bVar5 = false, 0.5 < max_ratio)) {
          bVar5 = _n_ids < 2.0;
        }
        if (bVar5) {
          uVar6 = ref_smooth_tri_pliant(ref_grid,node,&local_48);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x42f,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"ideal");
            return uVar6;
          }
        }
        else {
          uVar6 = ref_smooth_tri_weighted_ideal(ref_grid,node,&local_48);
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x431,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"ideal");
            return uVar6;
          }
        }
        tri_quality0 = 1.0;
        ideal[2]._4_4_ = 0;
        do {
          if (7 < ideal[2]._4_4_) {
            for (ids[1] = 0; ids[1] < 3; ids[1] = ids[1] + 1) {
              pRVar2->real[ids[1] + node * 0xf] = original[(long)ids[1] + -1];
            }
            uVar6 = ref_metric_interpolate_node(ref_grid,node);
            if ((uVar6 != 0) && (uVar6 != 5)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x465,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,"interp");
              return uVar6;
            }
            return 0;
          }
          for (ids[1] = 0; ids[1] < 3; ids[1] = ids[1] + 1) {
            pRVar2->real[ids[1] + node * 0xf] =
                 tri_quality0 * ideal[(long)ids[1] + -1] +
                 (1.0 - tri_quality0) * original[(long)ids[1] + -1];
          }
          uVar6 = ref_metric_interpolate_node(ref_grid,node);
          if ((uVar6 != 0) && (uVar6 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x43a,"ref_smooth_no_geom_tri_improve",(ulong)uVar6,
                   "ref_metric_interpolate_node failed");
            return uVar6;
          }
          if (uVar6 == 0) {
            uVar7 = ref_smooth_tri_quality_around(ref_grid,node,&tet_quality);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x43c,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,"q");
              return uVar7;
            }
            uVar7 = ref_smooth_tri_ratio_around(ref_grid,node,&max_ratio,(REF_DBL *)&n_ids);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x43e,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,"ratio");
              return uVar7;
            }
            uVar7 = ref_smooth_valid_no_geom_tri(ref_grid,node,&interp_status);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x440,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,"twod tri");
              return uVar7;
            }
            bVar4 = false;
            if (interp_status != 0) {
              bVar4 = ref_grid->adapt->post_min_ratio <= max_ratio;
            }
            local_11e = false;
            if (bVar4) {
              local_11e = _n_ids <= ref_grid->adapt->post_max_ratio;
            }
            if (bVar5) {
              local_11d = (local_11e && tri_quality * 0.9 < tet_quality) && 0.4 < tet_quality;
            }
            else {
              local_11e = local_11e && tri_quality < tet_quality;
              local_11d = local_11e;
            }
            interp_status = (REF_STATUS)local_11d;
            if (interp_status != 0) {
              if ((node < 0) || (ref_grid->cell[8]->ref_adj->nnode <= node)) {
                local_124 = -1;
              }
              else {
                local_124 = ref_grid->cell[8]->ref_adj->first[node];
              }
              if (local_124 == -1) {
                return 0;
              }
              uVar7 = ref_smooth_tet_quality_around(ref_grid,node,&min_ratio);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x451,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,"q");
                return uVar7;
              }
              uVar7 = ref_smooth_tet_ratio_around(ref_grid,node,&max_ratio,(REF_DBL *)&n_ids);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                       ,0x454,"ref_smooth_no_geom_tri_improve",(ulong)uVar7,"ratio");
                return uVar7;
              }
              pRVar1 = &ref_grid->adapt->smooth_min_quality;
              if (((*pRVar1 <= min_ratio && min_ratio != *pRVar1) &&
                  (ref_grid->adapt->post_min_ratio <= max_ratio)) &&
                 (_n_ids <= ref_grid->adapt->post_max_ratio)) {
                return 0;
              }
            }
          }
          tri_quality0 = tri_quality0 * 0.5;
          if ((ref_interp._4_4_ != -1) && (uVar6 != 0)) {
            pRVar3->cell[node] = ref_interp._4_4_;
          }
          ideal[2]._4_4_ = ideal[2]._4_4_ + 1;
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_no_geom_tri_improve(REF_GRID ref_grid,
                                                         REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT tries;
  REF_DBL ideal[3], original[3];
  REF_DBL backoff, tri_quality0, tri_quality, tet_quality, min_ratio, max_ratio;
  REF_INT ixyz;
  REF_INT n_ids, ids[2];
  REF_BOOL allowed, accept, geom_face;
  REF_STATUS interp_status;
  REF_INT interp_guess;
  REF_INTERP ref_interp = ref_grid_interp(ref_grid);
  REF_BOOL pliant_smoothing = REF_FALSE;

  /* can't handle mixed elements */
  if (!ref_cell_node_empty(ref_grid_qua(ref_grid), node)) return REF_SUCCESS;
  /* can't mixed elements */
  if (!ref_cell_node_empty(ref_grid_pyr(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_pri(ref_grid), node) ||
      !ref_cell_node_empty(ref_grid_hex(ref_grid), node))
    return REF_SUCCESS;
  /* won't keep an edg straight */
  if (!ref_cell_node_empty(ref_grid_edg(ref_grid), node)) return REF_SUCCESS;

  /* don't move edge nodes that span face ids */
  RXS(ref_cell_id_list_around(ref_grid_tri(ref_grid), node, 2, &n_ids, ids),
      REF_INCREASE_LIMIT, "count faceids");
  if (n_ids > 1) return REF_SUCCESS;

  /* not for nodes with geom support */
  RSS(ref_geom_is_a(ref_grid_geom(ref_grid), node, REF_GEOM_FACE, &geom_face),
      "face check");
  if (geom_face) return REF_SUCCESS;

  RSS(ref_smooth_node_same_normal(ref_grid, node, &allowed), "normal dev");
  if (!allowed) return REF_SUCCESS;

  for (ixyz = 0; ixyz < 3; ixyz++)
    original[ixyz] = ref_node_xyz(ref_node, ixyz, node);
  interp_guess = REF_EMPTY;
  if (NULL != ref_interp) {
    if (ref_interp_continuously(ref_interp)) {
      interp_guess = ref_interp_cell(ref_interp, node);
    }
  }

  RSS(ref_smooth_tri_quality_around(ref_grid, node, &tri_quality0), "q");
  RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
      "ratio");
  pliant_smoothing = (tri_quality0 > 0.5 && min_ratio > 0.5 && max_ratio < 2.0);

  if (pliant_smoothing) {
    RSS(ref_smooth_tri_pliant(ref_grid, node, ideal), "ideal");
  } else {
    RSS(ref_smooth_tri_weighted_ideal(ref_grid, node, ideal), "ideal");
  }

  backoff = 1.0;
  for (tries = 0; tries < 8; tries++) {
    for (ixyz = 0; ixyz < 3; ixyz++)
      ref_node_xyz(ref_node, ixyz, node) =
          backoff * ideal[ixyz] + (1.0 - backoff) * original[ixyz];
    interp_status = ref_metric_interpolate_node(ref_grid, node);
    RXS(interp_status, REF_NOT_FOUND, "ref_metric_interpolate_node failed");
    if (REF_SUCCESS == interp_status) {
      RSS(ref_smooth_tri_quality_around(ref_grid, node, &tri_quality), "q");
      RSS(ref_smooth_tri_ratio_around(ref_grid, node, &min_ratio, &max_ratio),
          "ratio");

      RSS(ref_smooth_valid_no_geom_tri(ref_grid, node, &accept), "twod tri");
      accept =
          accept && (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio));
      accept =
          accept && (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio));

      if (pliant_smoothing) {
        accept = accept && (tri_quality > 0.9 * tri_quality0);
        accept = accept && (tri_quality > 0.4);
      } else {
        accept = accept && (tri_quality > tri_quality0);
      }

      if (accept) {
        if (ref_cell_node_empty(ref_grid_tet(ref_grid), node)) {
          return REF_SUCCESS;
        } else {
          RSS(ref_smooth_tet_quality_around(ref_grid, node, &tet_quality), "q");
          RSS(ref_smooth_tet_ratio_around(ref_grid, node, &min_ratio,
                                          &max_ratio),
              "ratio");
          if ((REF_SUCCESS == interp_status) &&
              (tet_quality > ref_grid_adapt(ref_grid, smooth_min_quality)) &&
              (min_ratio >= ref_grid_adapt(ref_grid, post_min_ratio)) &&
              (max_ratio <= ref_grid_adapt(ref_grid, post_max_ratio))) {
            return REF_SUCCESS;
          }
        }
      }
    }
    backoff *= 0.5;
    if (REF_EMPTY != interp_guess && REF_SUCCESS != interp_status)
      ref_interp_cell(ref_interp, node) = interp_guess;
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    ref_node_xyz(ref_node, ixyz, node) = original[ixyz];
  RXS(ref_metric_interpolate_node(ref_grid, node), REF_NOT_FOUND, "interp");

  return REF_SUCCESS;
}